

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O1

void __thiscall ON_BrepFace::DestroyMesh(ON_BrepFace *this,mesh_type mt)

{
  Impl *pIVar1;
  int iVar2;
  recursive_mutex *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  __mutex = &this->m_pImpl->m_mesh_mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    pIVar1 = this->m_pImpl;
    if (mt == preview_mesh) {
      p_Var3 = (pIVar1->m_preview_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (mt == analysis_mesh) {
      p_Var3 = (pIVar1->m_analysis_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (mt == render_mesh) {
      p_Var3 = (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      p_Var3 = (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pIVar1->m_render_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      pIVar1 = this->m_pImpl;
      (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      p_Var3 = (pIVar1->m_analysis_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pIVar1->m_analysis_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      pIVar1 = this->m_pImpl;
      (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      p_Var3 = (pIVar1->m_preview_mesh).
               super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pIVar1->m_preview_mesh).super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void ON_BrepFace::DestroyMesh(ON::mesh_type mt)
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  switch(mt) {
  case ON::render_mesh:
    m_pImpl->m_render_mesh.reset();
    break;
  case ON::analysis_mesh:
    m_pImpl->m_analysis_mesh.reset();
    break;
  case ON::preview_mesh:
    m_pImpl->m_preview_mesh.reset();
    break;
  default:
    m_pImpl->m_render_mesh.reset();
    m_pImpl->m_analysis_mesh.reset();
    m_pImpl->m_preview_mesh.reset();
    break;
  }
}